

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::
Stack<std::unique_ptr<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_>_>_>_>
::~Stack(Stack<std::unique_ptr<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_>_>_>_>
         *this)

{
  ulong uVar1;
  default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_>_> *pdVar2;
  pointer *__ptr;
  default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_>_> *this_00;
  
  pdVar2 = (default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_>_> *
           )this->_stack;
  this_00 = (default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_>_>
             *)this->_cursor;
  if (this_00 != pdVar2) {
    do {
      this_00 = this_00 + -8;
      if (*(Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_> **)this_00 !=
          (Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_> *)0x0) {
        std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_>_>
        ::operator()(this_00,*(Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_> **)
                              this_00);
      }
      *(undefined8 *)this_00 = 0;
      pdVar2 = (default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_>_>
                *)this->_stack;
    } while (this_00 != pdVar2);
  }
  if (pdVar2 != (default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::IntegerConstantType>_>_>
                 *)0x0) {
    uVar1 = this->_capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar1 == 0) {
      *(undefined8 *)pdVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pdVar2;
    }
    else if (uVar1 < 0x11) {
      *(undefined8 *)pdVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pdVar2;
    }
    else if (uVar1 < 0x19) {
      *(undefined8 *)pdVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pdVar2;
    }
    else if (uVar1 < 0x21) {
      *(undefined8 *)pdVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pdVar2;
    }
    else if (uVar1 < 0x31) {
      *(undefined8 *)pdVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pdVar2;
    }
    else {
      if (0x40 < uVar1) {
        operator_delete(pdVar2,0x10);
        return;
      }
      *(undefined8 *)pdVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pdVar2;
    }
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }